

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int *local_258;
  int *sortpointer [65];
  int t;
  vorbis_info_floor1 *info;
  int local_38;
  int rangebits;
  int maxclass;
  int count;
  int k;
  int j;
  codec_setup_info *ci;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  pvVar1 = vi->codec_setup;
  rangebits = 0;
  local_38 = -1;
  vi_local = (vorbis_info *)calloc(1,0x460);
  lVar2 = oggpack_read(opb,5);
  vi_local->version = (int)lVar2;
  for (count = 0; count < vi_local->version; count = count + 1) {
    lVar2 = oggpack_read(opb,4);
    (&vi_local->channels)[count] = (int)lVar2;
    if ((&vi_local->channels)[count] < 0) goto LAB_002cd616;
    if (local_38 < (&vi_local->channels)[count]) {
      local_38 = (&vi_local->channels)[count];
    }
  }
  for (count = 0; count < local_38 + 1; count = count + 1) {
    lVar2 = oggpack_read(opb,3);
    *(int *)((long)&vi_local[2].bitrate_upper + (long)count * 4) = (int)lVar2 + 1;
    lVar2 = oggpack_read(opb,2);
    *(int *)((long)&vi_local[3].bitrate_nominal + (long)count * 4) = (int)lVar2;
    if (*(int *)((long)&vi_local[3].bitrate_nominal + (long)count * 4) < 0) goto LAB_002cd616;
    if (*(int *)((long)&vi_local[3].bitrate_nominal + (long)count * 4) != 0) {
      lVar2 = oggpack_read(opb,8);
      *(int *)((long)&vi_local[4].bitrate_lower + (long)count * 4) = (int)lVar2;
    }
    if ((*(int *)((long)&vi_local[4].bitrate_lower + (long)count * 4) < 0) ||
       (*(int *)((long)pvVar1 + 0x20) <=
        *(int *)((long)&vi_local[4].bitrate_lower + (long)count * 4))) goto LAB_002cd616;
    for (maxclass = 0;
        maxclass <
        1 << ((byte)*(undefined4 *)((long)&vi_local[3].bitrate_nominal + (long)count * 4) & 0x1f);
        maxclass = maxclass + 1) {
      lVar2 = oggpack_read(opb,8);
      *(int *)((long)&vi_local[5].bitrate_window + (long)maxclass * 4 + (long)count * 0x20) =
           (int)lVar2 + -1;
      if ((*(int *)((long)&vi_local[5].bitrate_window + (long)maxclass * 4 + (long)count * 0x20) <
           -1) || (*(int *)((long)pvVar1 + 0x20) <=
                   *(int *)((long)&vi_local[5].bitrate_window +
                           (long)maxclass * 4 + (long)count * 0x20))) goto LAB_002cd616;
    }
  }
  lVar2 = oggpack_read(opb,2);
  *(int *)&vi_local[0xe].codec_setup = (int)lVar2 + 1;
  lVar2 = oggpack_read(opb,4);
  if ((int)lVar2 < 0) {
LAB_002cd616:
    floor1_free_info(vi_local);
    vi_local = (vorbis_info *)0x0;
  }
  else {
    maxclass = 0;
    for (count = 0; count < vi_local->version; count = count + 1) {
      rangebits = *(int *)((long)&vi_local[2].bitrate_upper + (long)(&vi_local->channels)[count] * 4
                          ) + rangebits;
      if (0x3f < rangebits) goto LAB_002cd616;
      for (; maxclass < rangebits; maxclass = maxclass + 1) {
        lVar3 = oggpack_read(opb,(int)lVar2);
        sortpointer[0x40]._4_4_ = (int)lVar3;
        *(int *)((long)&vi_local[0xe].codec_setup + (long)(maxclass + 2) * 4 + 4) =
             sortpointer[0x40]._4_4_;
        if ((sortpointer[0x40]._4_4_ < 0) || (1 << ((byte)lVar2 & 0x1f) <= sortpointer[0x40]._4_4_))
        goto LAB_002cd616;
      }
    }
    *(undefined4 *)((long)&vi_local[0xe].codec_setup + 4) = 0;
    vi_local[0xf].version = 1 << ((byte)lVar2 & 0x1f);
    for (count = 0; count < rangebits + 2; count = count + 1) {
      sortpointer[(long)count + -1] =
           (int *)((long)&vi_local[0xe].codec_setup + (long)count * 4 + 4);
    }
    qsort(&local_258,(long)(rangebits + 2),8,icomp);
    for (count = 1; count < rangebits + 2; count = count + 1) {
      if (*sortpointer[(long)(count + -1) + -1] == *sortpointer[(long)count + -1])
      goto LAB_002cd616;
    }
  }
  return vi_local;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(info->partitionclass[j]<0)goto err_out;
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
        goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */
  rangebits=oggpack_read(opb,4);
  if(rangebits<0)goto err_out;

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    if(count>VIF_POSIT) goto err_out;
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
        goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  /* don't allow repeated values in post list as they'd result in
     zero-length segments */
  {
    int *sortpointer[VIF_POSIT+2];
    for(j=0;j<count+2;j++)sortpointer[j]=info->postlist+j;
    qsort(sortpointer,count+2,sizeof(*sortpointer),icomp);

    for(j=1;j<count+2;j++)
      if(*sortpointer[j-1]==*sortpointer[j])goto err_out;
  }

  return(info);

 err_out:
  floor1_free_info(info);
  return(NULL);
}